

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall
QPDF::optimize(QPDF *this,
              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              *object_stream_data,bool allow_changes,
              function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  function<int_(QPDFObjectHandle_&)> local_40;
  
  std::function<int_(QPDFObjectHandle_&)>::function(&local_40,skip_stream_parameters);
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,object_stream_data,allow_changes,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void
QPDF::optimize(
    std::map<int, int> const& object_stream_data,
    bool allow_changes,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    optimize_internal(object_stream_data, allow_changes, skip_stream_parameters);
}